

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-haproxy.c
# Opt level: O0

CURLcode Curl_cf_haproxy_insert_after(Curl_cfilter *cf_at,Curl_easy *data)

{
  CURLcode CVar1;
  Curl_cfilter *pCStack_20;
  CURLcode result;
  Curl_cfilter *cf;
  Curl_easy *data_local;
  Curl_cfilter *cf_at_local;
  
  cf = (Curl_cfilter *)data;
  data_local = (Curl_easy *)cf_at;
  CVar1 = cf_haproxy_create(&stack0xffffffffffffffe0,data);
  if (CVar1 == CURLE_OK) {
    Curl_conn_cf_insert_after((Curl_cfilter *)data_local,pCStack_20);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cf_haproxy_insert_after(struct Curl_cfilter *cf_at,
                                      struct Curl_easy *data)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  result = cf_haproxy_create(&cf, data);
  if(result)
    goto out;
  Curl_conn_cf_insert_after(cf_at, cf);

out:
  return result;
}